

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

base_learner * memory_tree_setup(options_i *options,vw *all)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  typed_option<unsigned_long> *ptVar4;
  option_group_definition *poVar5;
  typed_option<float> *op;
  typed_option<unsigned_int> *op_00;
  typed_option<int> *ptVar6;
  ulong uVar7;
  ostream *poVar8;
  base_learner *pbVar9;
  single_learner *psVar10;
  learner<memory_tree_ns::memory_tree,_example> *plVar11;
  long lVar12;
  undefined **ppuVar13;
  label_parser *plVar14;
  size_t ws;
  byte bVar15;
  __type_conflict _Var16;
  double dVar17;
  free_ptr<memory_tree_ns::memory_tree> tree;
  allocator local_95c;
  allocator local_95b;
  allocator local_95a;
  allocator local_959;
  allocator local_958;
  allocator local_957;
  allocator local_956;
  allocator local_955;
  allocator local_954;
  allocator local_953;
  allocator local_952;
  allocator local_951;
  allocator local_950;
  allocator local_94f;
  allocator local_94e;
  allocator local_94d;
  allocator local_94c;
  allocator local_94b;
  allocator local_94a;
  allocator local_949;
  double local_948;
  double dStack_940;
  string local_938 [32];
  string local_918;
  string local_8f8 [32];
  string local_8d8;
  string local_8b8 [32];
  string local_898;
  string local_878 [32];
  string local_858;
  string local_838 [32];
  string local_818;
  string local_7f8 [32];
  string local_7d8;
  string local_7b8 [32];
  string local_798;
  string local_778 [32];
  string local_758;
  string local_738 [32];
  string local_718;
  string local_6f8 [32];
  string local_6d8;
  string local_6b8;
  option_group_definition new_options;
  typed_option<unsigned_long> local_660;
  typed_option<int> local_5c0;
  typed_option<int> local_520;
  typed_option<int> local_480;
  typed_option<int> local_3e0;
  typed_option<int> local_340;
  typed_option<unsigned_int> local_2a0;
  typed_option<float> local_200;
  typed_option<unsigned_long> local_160;
  typed_option<unsigned_long> local_c0;
  
  bVar15 = 0;
  scoped_calloc_or_throw<memory_tree_ns::memory_tree>();
  std::__cxx11::string::string((string *)&local_6b8,"Memory Tree",(allocator *)&local_660);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_6b8);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::string((string *)&local_6d8,"memory_tree",&local_949);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_660,&local_6d8,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->max_nodes)
  ;
  local_660.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_660,0);
  std::__cxx11::string::string(local_6f8,"Make a memory tree with at most <n> nodes",&local_94a);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (&new_options,ptVar4);
  std::__cxx11::string::string((string *)&local_718,"max_number_of_labels",&local_94b);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_c0,&local_718,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
              max_num_labels);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_c0,10);
  std::__cxx11::string::string(local_738,"max number of unique label",&local_94c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,ptVar4);
  std::__cxx11::string::string((string *)&local_758,"leaf_example_multiplier",&local_94d);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_160,&local_758,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
              leaf_example_multiplier);
  ptVar4 = VW::config::typed_option<unsigned_long>::default_value(&local_160,1);
  std::__cxx11::string::string
            (local_778,"multiplier on examples per leaf (default = log nodes)",&local_94e);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,ptVar4);
  std::__cxx11::string::string((string *)&local_798,"alpha",&local_94f);
  VW::config::typed_option<float>::typed_option
            (&local_200,&local_798,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->alpha);
  op = VW::config::typed_option<float>::default_value(&local_200,0.1);
  std::__cxx11::string::string(local_7b8,"Alpha",&local_950);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar5,op);
  std::__cxx11::string::string((string *)&local_7d8,"dream_repeats",&local_951);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_2a0,&local_7d8,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
              dream_repeats);
  op_00 = VW::config::typed_option<unsigned_int>::default_value(&local_2a0,1);
  std::__cxx11::string::string
            (local_7f8,"number of dream operations per example (default = 1)",&local_952);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar5,op_00);
  std::__cxx11::string::string((string *)&local_818,"top_K",&local_953);
  VW::config::typed_option<int>::typed_option
            (&local_340,&local_818,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->top_K);
  ptVar6 = VW::config::typed_option<int>::default_value(&local_340,1);
  std::__cxx11::string::string(local_838,"top K prediction error (default 1)",&local_954);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar5,ptVar6);
  std::__cxx11::string::string((string *)&local_858,"learn_at_leaf",&local_955);
  VW::config::typed_option<int>::typed_option
            (&local_3e0,&local_858,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
              learn_at_leaf);
  ptVar6 = VW::config::typed_option<int>::default_value(&local_3e0,0);
  std::__cxx11::string::string(local_878,"whether or not learn at leaf (defualt = True)",&local_956)
  ;
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar5,ptVar6);
  std::__cxx11::string::string((string *)&local_898,"oas",&local_957);
  VW::config::typed_option<int>::typed_option
            (&local_480,&local_898,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->oas);
  ptVar6 = VW::config::typed_option<int>::default_value(&local_480,0);
  std::__cxx11::string::string(local_8b8,"use oas at the leaf",&local_958);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar5,ptVar6);
  std::__cxx11::string::string((string *)&local_8d8,"dream_at_update",&local_959);
  VW::config::typed_option<int>::typed_option
            (&local_520,&local_8d8,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
              dream_at_update);
  ptVar6 = VW::config::typed_option<int>::default_value(&local_520,0);
  std::__cxx11::string::string
            (local_8f8,"turn on dream operations at reward based update as well",&local_95a);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar5,ptVar6);
  std::__cxx11::string::string((string *)&local_918,"online",&local_95b);
  VW::config::typed_option<int>::typed_option
            (&local_5c0,&local_918,
             &(tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->online);
  ptVar6 = VW::config::typed_option<int>::default_value(&local_5c0,0);
  std::__cxx11::string::string
            (local_938,"turn on dream operations at reward based update as well",&local_95c);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar5,ptVar6);
  std::__cxx11::string::~string(local_938);
  VW::config::typed_option<int>::~typed_option(&local_5c0);
  std::__cxx11::string::~string((string *)&local_918);
  std::__cxx11::string::~string(local_8f8);
  VW::config::typed_option<int>::~typed_option(&local_520);
  std::__cxx11::string::~string((string *)&local_8d8);
  std::__cxx11::string::~string(local_8b8);
  VW::config::typed_option<int>::~typed_option(&local_480);
  std::__cxx11::string::~string((string *)&local_898);
  std::__cxx11::string::~string(local_878);
  VW::config::typed_option<int>::~typed_option(&local_3e0);
  std::__cxx11::string::~string((string *)&local_858);
  std::__cxx11::string::~string(local_838);
  VW::config::typed_option<int>::~typed_option(&local_340);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string(local_7f8);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_2a0);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::__cxx11::string::~string(local_7b8);
  VW::config::typed_option<float>::~typed_option(&local_200);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string(local_778);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_160);
  std::__cxx11::string::~string((string *)&local_758);
  std::__cxx11::string::~string(local_738);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_c0);
  std::__cxx11::string::~string((string *)&local_718);
  std::__cxx11::string::~string(local_6f8);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_660);
  std::__cxx11::string::~string((string *)&local_6d8);
  (**options->_vptr_options_i)(options,&new_options);
  if ((tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->max_nodes == 0) {
    plVar11 = (learner<memory_tree_ns::memory_tree,_example> *)0x0;
  }
  else {
    (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->all = all;
    (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->current_pass = 0;
    (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->final_pass =
         all->numpasses;
    dStack_940 = (double)CONCAT44(0x45300000,
                                  (int)((tree._M_t.
                                         super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>
                                         .
                                         super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>
                                        ._M_head_impl)->leaf_example_multiplier >> 0x20)) -
                 1.9342813113834067e+25;
    local_948 = dStack_940 +
                ((double)CONCAT44(0x43300000,
                                  (int)(tree._M_t.
                                        super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>
                                        .super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>
                                       ._M_head_impl)->leaf_example_multiplier) - 4503599627370496.0
                );
    _Var16 = std::log<unsigned_long>
                       ((tree._M_t.
                         super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
                        max_nodes);
    dVar17 = (_Var16 / 0.6931471805599453) * local_948;
    uVar7 = (ulong)dVar17;
    (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->max_leaf_examples =
         (long)(dVar17 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
    memory_tree_ns::init_tree
              (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl);
    if (all->quiet == false) {
      poVar8 = std::operator<<(&(all->trace_message).super_ostream,"memory_tree:");
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"max_nodes = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"max_leaf_examples = ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"alpha = ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(tree._M_t.
                                  super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>
                                  .super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>.
                                 _M_head_impl)->alpha);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"oas = ");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(tree._M_t.
                                  super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>
                                  .super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>.
                                 _M_head_impl)->oas);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"online =");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(tree._M_t.
                                  super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>
                                  .super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>.
                                 _M_head_impl)->online);
      poVar8 = std::operator<<(poVar8," ");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
    ws = (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->max_nodes + 1;
    if ((tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->oas == 0) {
      pbVar9 = setup_base(options,all);
      psVar10 = LEARNER::as_singleline<char,char>(pbVar9);
      plVar11 = LEARNER::
                init_multiclass_learner<memory_tree_ns::memory_tree,example,LEARNER::learner<char,example>>
                          (&tree,psVar10,memory_tree_ns::learn,memory_tree_ns::predict,all->p,ws,
                           multiclass);
      *(code **)(plVar11 + 0x80) = memory_tree_ns::save_load_memory_tree;
      uVar2 = *(undefined8 *)(plVar11 + 0x18);
      uVar3 = *(undefined8 *)(plVar11 + 0x20);
      *(undefined8 *)(plVar11 + 0x70) = uVar2;
      *(undefined8 *)(plVar11 + 0x78) = uVar3;
      *(undefined8 *)(plVar11 + 0x88) = uVar2;
      *(undefined8 *)(plVar11 + 0x90) = uVar3;
      *(code **)(plVar11 + 0x98) = memory_tree_ns::end_pass;
      *(undefined8 *)(plVar11 + 0xb8) = uVar2;
      *(undefined8 *)(plVar11 + 0xc0) = uVar3;
      *(code **)(plVar11 + 200) = memory_tree_ns::finish;
    }
    else {
      sVar1 = (tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl)->
              max_num_labels;
      pbVar9 = setup_base(options,all);
      psVar10 = LEARNER::as_singleline<char,char>(pbVar9);
      plVar11 = LEARNER::learner<memory_tree_ns::memory_tree,example>::
                init_learner<LEARNER::learner<char,example>>
                          (tree._M_t.
                           super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t
                           .super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl,
                           psVar10,memory_tree_ns::learn,memory_tree_ns::predict,ws + sVar1,
                           multilabels);
      tree._M_t.super___uniq_ptr_impl<memory_tree_ns::memory_tree,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_memory_tree_ns::memory_tree_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_memory_tree_ns::memory_tree_*,_false>._M_head_impl = (memory_tree *)0x0;
      uVar2 = *(undefined8 *)(plVar11 + 0x18);
      uVar3 = *(undefined8 *)(plVar11 + 0x20);
      *(undefined8 *)(plVar11 + 0x88) = uVar2;
      *(undefined8 *)(plVar11 + 0x90) = uVar3;
      *(code **)(plVar11 + 0x98) = memory_tree_ns::end_pass;
      *(code **)(plVar11 + 0x80) = memory_tree_ns::save_load_memory_tree;
      *(undefined8 *)(plVar11 + 0x70) = uVar2;
      *(undefined8 *)(plVar11 + 0x78) = uVar3;
      *(undefined8 *)(plVar11 + 0xb8) = uVar2;
      *(undefined8 *)(plVar11 + 0xc0) = uVar3;
      *(code **)(plVar11 + 200) = memory_tree_ns::finish;
      ppuVar13 = &MULTILABEL::multilabel;
      plVar14 = &all->p->lp;
      for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
        plVar14->default_label = (_func_void_void_ptr *)*ppuVar13;
        ppuVar13 = ppuVar13 + (ulong)bVar15 * -2 + 1;
        plVar14 = (label_parser *)((long)plVar14 + (ulong)bVar15 * -0x10 + 8);
      }
      all->label_type = multi;
      all->delete_prediction = (_func_void_void_ptr *)PTR_delete_label_002eabe0;
    }
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::~unique_ptr(&tree);
  return (base_learner *)plVar11;
}

Assistant:

base_learner* memory_tree_setup(options_i& options, vw& all)
{
    using namespace memory_tree_ns;
	auto tree = scoped_calloc_or_throw<memory_tree>();
    option_group_definition new_options("Memory Tree");

    new_options.add(make_option("memory_tree", tree->max_nodes).keep().default_value(0).help("Make a memory tree with at most <n> nodes"))
        .add(make_option("max_number_of_labels",tree->max_num_labels).default_value(10).help("max number of unique label"))
        .add(make_option("leaf_example_multiplier",tree->leaf_example_multiplier).default_value(1).help("multiplier on examples per leaf (default = log nodes)"))
        .add(make_option("alpha", tree->alpha).default_value(0.1f).help("Alpha"))
        .add(make_option("dream_repeats", tree->dream_repeats).default_value(1).help("number of dream operations per example (default = 1)"))
        .add(make_option("top_K",tree->top_K).default_value(1).help("top K prediction error (default 1)"))
        .add(make_option("learn_at_leaf",tree->learn_at_leaf).default_value(0).help("whether or not learn at leaf (defualt = True)"))
        .add(make_option("oas", tree->oas).default_value(0).help("use oas at the leaf"))
        .add(make_option("dream_at_update", tree->dream_at_update).default_value(0).help("turn on dream operations at reward based update as well"))
        .add(make_option("online", tree->online).default_value(0).help("turn on dream operations at reward based update as well"));
    options.add_and_parse(new_options);
if (!tree->max_nodes)
{
  return nullptr;
}

    tree->all = &all;
    tree->current_pass = 0;
    tree->final_pass = all.numpasses;

    tree->max_leaf_examples = tree->leaf_example_multiplier*(log(tree->max_nodes)/log(2));

    
    init_tree(*tree);

    if (!all.quiet)
        all.trace_message << "memory_tree:" << " "
            <<"max_nodes = "<< tree->max_nodes << " " 
            <<"max_leaf_examples = "<<tree->max_leaf_examples<<" "
 		    <<"alpha = "<<tree->alpha<<" "
            <<"oas = "<<tree->oas<<" "
            <<"online ="<<tree->online<<" "
            <<std::endl;
    
    size_t num_learners = 0;
    
    //multi-class classification
    if (tree->oas == false){
        num_learners = tree->max_nodes + 1;
        learner<memory_tree, example>& l = init_multiclass_learner (tree, 
                as_singleline(setup_base (options,all)),
                learn,
                predict,
                all.p, num_learners);
         //srand(time(0));
        l.set_save_load(save_load_memory_tree);
        l.set_end_pass(end_pass);
        l.set_finish(finish);

        return make_base (l);
    } //multi-label classification
    else{
        num_learners = tree->max_nodes + 1 + tree->max_num_labels;
        learner<memory_tree,example>& l = 
        init_learner(tree, 
                as_singleline(setup_base(options,all)), 
                learn, 
                predict, 
                num_learners,
                prediction_type::multilabels);

	//all.p->lp = MULTILABEL::multilabel;
        //all.label_type = label_type::multi;
        //all.delete_prediction = MULTILABEL::multilabel.delete_label;
         //srand(time(0));
	l.set_end_pass(end_pass);
        l.set_save_load(save_load_memory_tree);
        //l.set_end_pass(end_pass);
        l.set_finish(finish);

	all.p->lp = MULTILABEL::multilabel;
	all.label_type = label_type::multi;
	all.delete_prediction = MULTILABEL::multilabel.delete_label;

        return make_base (l);
    }

}